

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O2

void __thiscall
ConfidentialTxOut_Constractor2_Test::~ConfidentialTxOut_Constractor2_Test
          (ConfidentialTxOut_Constractor2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor2) {
  // Script, ConfidentialAssetId, ConfidentialValue, ConfidentialNonce, ByteData, ByteData
  ConfidentialTxOut txout(exp_script, exp_asset, exp_value, exp_nonce,
                          exp_surjection_proof, exp_range_proof);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 0);
}